

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

int slow_memcmp(void *_a,void *_b,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t sVar3;
  uint8_t *b;
  uint8_t *a;
  
  sVar3 = 0;
  do {
    if (n == sVar3) {
      return 0;
    }
    pbVar1 = (byte *)((long)_a + sVar3);
    pbVar2 = (byte *)((long)_b + sVar3);
    sVar3 = sVar3 + 1;
  } while (*pbVar1 == *pbVar2);
  return -(uint)(*pbVar1 < *pbVar2) | 1;
}

Assistant:

ATTRIBUTE_UNUSED
static int slow_memcmp(const void *_a, const void *_b, size_t n) {
  const uint8_t *a = reinterpret_cast<const uint8_t *>(_a);
  const uint8_t *b = reinterpret_cast<const uint8_t *>(_b);
  while (n-- != 0) {
    uint8_t ac = *a++;
    uint8_t bc = *b++;
    if (ac != bc) {
      if (ac < bc) {
        return -1;
      }
      return 1;
    }
  }
  return 0;
}